

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O0

void iutest::TestEnv::ReleaseGlobalTestEnvironment(void)

{
  bool bVar1;
  iuEnvironmentList *piVar2;
  reference ppEVar3;
  const_iterator local_30;
  Environment **local_28;
  Environment *local_20;
  Environment *p;
  __normal_iterator<iutest::Environment_**,_std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>_>
  local_10;
  iterator it;
  
  piVar2 = environments();
  local_10._M_current =
       (Environment **)
       std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>::begin(piVar2);
  while( true ) {
    piVar2 = environments();
    p = (Environment *)
        std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>::end(piVar2);
    bVar1 = __gnu_cxx::operator!=
                      (&local_10,
                       (__normal_iterator<iutest::Environment_**,_std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>_>
                        *)&p);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<iutest::Environment_**,_std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>_>
              ::operator*(&local_10);
    local_20 = *ppEVar3;
    piVar2 = environments();
    __gnu_cxx::
    __normal_iterator<iutest::Environment*const*,std::vector<iutest::Environment*,std::allocator<iutest::Environment*>>>
    ::__normal_iterator<iutest::Environment**>
              ((__normal_iterator<iutest::Environment*const*,std::vector<iutest::Environment*,std::allocator<iutest::Environment*>>>
                *)&local_30,&local_10);
    local_28 = (Environment **)
               std::vector<iutest::Environment_*,_std::allocator<iutest::Environment_*>_>::erase
                         (piVar2,local_30);
    local_10._M_current = local_28;
    if (local_20 != (Environment *)0x0) {
      (**(code **)(*(long *)local_20 + 8))();
    }
  }
  return;
}

Assistant:

static void ReleaseGlobalTestEnvironment()
    {
        // すべて解放する
        for( iuEnvironmentList::iterator it=environments().begin(); it != environments().end(); )
        {
            Environment* p = *it;
            it = environments().erase(it);
            delete p;
        }
    }